

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  ulong uVar1;
  u8 *puVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  byte bVar6;
  undefined6 in_register_00000012;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  undefined6 in_register_00000032;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ushort local_50;
  
  uVar10 = CONCAT62(in_register_00000032,iStart);
  uVar7 = CONCAT62(in_register_00000012,iSize) & 0xffffffff;
  iVar13 = (int)CONCAT62(in_register_00000012,iSize);
  uVar4 = (uint)uVar10;
  uVar8 = iVar13 + uVar4;
  puVar2 = pPage->aData;
  uVar14 = (ulong)pPage->hdrOffset;
  uVar1 = uVar14 + 1;
  uVar9 = uVar1;
  if ((puVar2[uVar14 + 2] == '\0') && (puVar2[uVar1] == '\0')) {
    local_50 = 0;
    uVar15 = uVar1;
  }
  else {
    do {
      uVar15 = uVar9;
      uVar11 = *(ushort *)(puVar2 + uVar15);
      local_50 = uVar11 << 8 | uVar11 >> 8;
      uVar9 = (ulong)local_50;
      if (iStart <= local_50) goto LAB_00157daa;
    } while ((ushort)uVar15 < local_50);
    if (local_50 != 0) {
      uVar5 = 0x11c14;
      goto LAB_00158037;
    }
LAB_00157daa:
    uVar3 = pPage->pBt->usableSize;
    uVar12 = (uint)local_50;
    if (uVar3 - 4 < uVar12) {
      uVar5 = 0x11c19;
      goto LAB_00158037;
    }
    if (uVar8 + 3 < uVar12 || local_50 == 0) {
      bVar6 = 0;
    }
    else {
      bVar6 = (char)(uVar11 >> 8) - (char)uVar8;
      if (local_50 < uVar8) {
        uVar5 = 0x11c25;
        goto LAB_00158037;
      }
      uVar8 = (ushort)(*(ushort *)(puVar2 + uVar9 + 2) << 8 | *(ushort *)(puVar2 + uVar9 + 2) >> 8)
              + uVar12;
      if (uVar3 < uVar8) {
        uVar5 = 0x11c28;
        goto LAB_00158037;
      }
      uVar7 = (ulong)(uVar8 - uVar4);
      local_50 = *(ushort *)(puVar2 + uVar9) << 8 | *(ushort *)(puVar2 + uVar9) >> 8;
    }
    uVar3 = (uint)uVar15;
    if (((uint)uVar1 < uVar3) &&
       (uVar11 = *(ushort *)(puVar2 + uVar15 + 2) << 8 | *(ushort *)(puVar2 + uVar15 + 2) >> 8,
       uVar4 <= uVar11 + uVar3 + 3)) {
      uVar12 = uVar11 + uVar3;
      if (uVar4 < uVar12) {
        uVar5 = 0x11c35;
        goto LAB_00158037;
      }
      bVar6 = bVar6 + ((char)iStart - (char)uVar12);
      uVar7 = (ulong)(uVar8 - uVar3);
      uVar10 = uVar15;
    }
    if (puVar2[uVar14 + 7] < bVar6) {
      uVar5 = 0x11c3b;
      goto LAB_00158037;
    }
    puVar2[uVar14 + 7] = puVar2[uVar14 + 7] - bVar6;
  }
  uVar11 = *(ushort *)(puVar2 + uVar14 + 5);
  uVar9 = uVar10 & 0xffff;
  if ((pPage->pBt->btsFlags & 0xc) != 0) {
    memset(puVar2 + uVar9,0,uVar7 & 0xffff);
  }
  uVar4 = (uint)(ushort)(uVar11 << 8 | uVar11 >> 8);
  if ((uint)uVar9 <= uVar4) {
    if ((uint)uVar9 < uVar4) {
      uVar5 = 0x11c49;
    }
    else {
      if ((uint)uVar1 == (uint)uVar15) {
        *(ushort *)(puVar2 + uVar1) = local_50 << 8 | local_50 >> 8;
        puVar2[uVar14 + 5] = (u8)(uVar8 >> 8);
        puVar2[uVar14 + 6] = (u8)uVar8;
        goto LAB_00157fb8;
      }
      uVar5 = 0x11c4a;
    }
LAB_00158037:
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar5,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    return 0xb;
  }
  *(ushort *)(puVar2 + uVar15) = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
  puVar2[uVar9] = (u8)(local_50 >> 8);
  puVar2[uVar9 + 1] = (u8)local_50;
  puVar2[uVar9 + 2] = (u8)(uVar7 >> 8);
  puVar2[uVar9 + 3] = (u8)uVar7;
LAB_00157fb8:
  pPage->nFree = pPage->nFree + iVar13;
  return 0;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u16 x;                                /* Offset to cell content area */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */
  u8 *pTmp;                             /* Temporary ptr into data[] */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( CORRUPT_DB || iStart<=pPage->pBt->usableSize-4 );

  /* The list of freeblocks must be in ascending order.  Find the
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<=iPtr ){
        if( iFreeBlk==0 ) break; /* TH3: corrupt082.100 */
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>pPage->pBt->usableSize-4 ){ /* TH3: corrupt081.100 */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( iFreeBlk>iPtr || iFreeBlk==0 || CORRUPT_DB );

    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PAGE(pPage);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }

    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PAGE(pPage);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PAGE(pPage);
    data[hdr+7] -= nFrag;
  }
  pTmp = &data[hdr+5];
  x = get2byte(pTmp);
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    /* Overwrite deleted information with zeros when the secure_delete
    ** option is enabled */
    memset(&data[iStart], 0, iSize);
  }
  if( iStart<=x ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iStart<x ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iPtr!=hdr+1 ) return SQLITE_CORRUPT_PAGE(pPage);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
    put2byte(&data[iStart], iFreeBlk);
    put2byte(&data[iStart+2], iSize);
  }
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}